

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O1

void Bitmap_Operation::Save
               (string *path,Image *image,uint32_t startX,uint32_t startY,uint32_t width,
               uint32_t height)

{
  uint uVar1;
  value_type_conflict1 *__val;
  imageException *piVar2;
  undefined4 in_register_0000000c;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  undefined1 uVar8;
  uint uVar9;
  long lVar10;
  uchar *puVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> temp;
  fstream file;
  void *local_298;
  allocator_type local_28a;
  value_type_conflict1 local_289;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_288;
  ulong local_270;
  Image *local_268;
  undefined8 local_260;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_258;
  long local_240 [2];
  char local_230 [16];
  byte abStack_220 [496];
  
  local_260 = CONCAT44(in_register_0000000c,startY);
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,startX,startY,width,height);
  local_268 = image;
  if (image->_colorCount == '\x01') {
    lVar7 = 0x400;
    local_298 = operator_new(0x400);
    lVar10 = 0;
    memset(local_298,0,0x400);
    do {
      uVar8 = (undefined1)lVar10;
      *(undefined1 *)((long)local_298 + lVar10 * 4) = uVar8;
      *(undefined1 *)((long)local_298 + lVar10 * 4 + 1) = uVar8;
      *(undefined1 *)((long)local_298 + lVar10 * 4 + 2) = uVar8;
      lVar10 = lVar10 + 1;
      lVar7 = lVar7 + -4;
    } while (lVar7 != 0);
    pvVar4 = (void *)((long)local_298 + 0x400);
    iVar6 = 0x436;
  }
  else {
    iVar6 = 0x36;
    pvVar4 = (void *)0x0;
    local_298 = (void *)0x0;
  }
  local_270 = (ulong)local_268->_colorCount;
  std::fstream::fstream(local_240);
  std::fstream::open((string *)local_240,(_Ios_Openmode)path);
  if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) == 0) {
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x14);
    uVar9 = (int)local_270 * width + 3 & 0xfffffffc;
    iVar3 = uVar9 * height;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x14;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x10] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x11] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x13] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[4] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[5] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[7] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[8] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[9] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[10] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xb] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xc] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xd] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xe] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xf] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = 'B';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = 'M';
    *(int *)(local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 2) = iVar3 + iVar6;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[7] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[8] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[9] = '\0';
    *(int *)(local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 10) = iVar6;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::ostream::write(local_230,
                        (long)local_288.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_288,0x38);
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '(';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    *(uint32_t *)
     (local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + 4) = width;
    *(uint32_t *)
     (local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + 8) = height;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xc] = '\x01';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xd] = '\0';
    *(short *)(local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + 0xe) = (short)local_270 * 8;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x10] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x11] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x13] = '\0';
    *(int *)(local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x14) = iVar3;
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x18] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x19] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1a] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1b] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1c] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1d] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1e] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1f] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x20] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x21] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x22] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x23] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x24] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x25] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x26] = '\0';
    local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x27] = '\0';
    std::ostream::write(local_230,
                        (long)local_288.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (local_298 != pvVar4) {
      std::ostream::write(local_230,(long)local_298);
    }
    std::ostream::flush();
    uVar1 = local_268->_rowSize;
    puVar11 = local_268->_data;
    local_289 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_258,(ulong)uVar9,&local_289,&local_28a);
    if (height != 0) {
      puVar11 = puVar11 + (ulong)(startX * (int)local_270) +
                          (ulong)(((int)local_260 + -1 + height) * uVar1);
      uVar5 = local_270 & 0xffffffff;
      do {
        memcpy(local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,puVar11,uVar5 * width);
        std::ostream::write(local_230,
                            (long)local_258.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        std::ostream::flush();
        puVar11 = puVar11 + -(ulong)uVar1;
        height = height - 1;
      } while (height != 0);
    }
    if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) == 0) {
      if (local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::fstream::~fstream(local_240);
      if (local_298 != (void *)0x0) {
        operator_delete(local_298);
      }
      return;
    }
    piVar2 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(piVar2,"failed to write data into file");
    __cxa_throw(piVar2,&imageException::typeinfo,imageException::~imageException);
  }
  piVar2 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(piVar2,"Cannot create file for saving");
  __cxa_throw(piVar2,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Save( const std::string & path, const PenguinV_Image::Image & image, uint32_t startX, uint32_t startY,
               uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( image, startX, startY, width, height );

        uint32_t palleteSize = 0;
        std::vector < uint8_t > pallete;

        // Create a pallete only for gray-scale image
        if( image.colorCount() == 1u ) {
            pallete = generateGrayScalePallete();
            palleteSize = static_cast<uint32_t>( pallete.size() );
        }

        const uint8_t colorCount = image.colorCount();

        uint32_t lineLength = width * colorCount;
        if( lineLength % BITMAP_ALIGNMENT != 0 )
            lineLength = (lineLength / BITMAP_ALIGNMENT + 1) * BITMAP_ALIGNMENT;

        BitmapFileHeader header;
        BitmapInfoHeader info;

        header.bfSize    = header.overallSize + info.size() + palleteSize + lineLength * height;
        header.bfOffBits = header.overallSize + info.size() + palleteSize;

        info.setWidth     ( width );
        info.setHeight    ( height );
        info.setColorCount( colorCount );
        info.setImageSize ( lineLength * height );

        std::fstream file;
        file.open( path, std::fstream::out | std::fstream::trunc | std::fstream::binary );

        if( !file )
            throw imageException( "Cannot create file for saving" );

        std::vector < uint8_t > data( sizeof( BitmapFileHeader ) );

        header.get( data );
        file.write( reinterpret_cast<const char *>(data.data()), header.overallSize );

        data.resize( sizeof( BitmapInfoHeader ) );

        info.get( data );
        file.write( reinterpret_cast<const char *>(data.data()), info.size() );

        if( !pallete.empty() )
            file.write( reinterpret_cast<const char *>(pallete.data()), static_cast<std::streamsize>(pallete.size()) );

        file.flush();

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY = image.data() + (startY + height - 1) * rowSize + startX * colorCount;

        std::vector < uint8_t > temp( lineLength, 0 );

        for( uint32_t rowId = 0; rowId < height; ++rowId, imageY -= rowSize ) {
            memcpy( temp.data(), imageY, sizeof( uint8_t ) * width * colorCount );

            file.write( reinterpret_cast<const char *>(temp.data()), lineLength );
            file.flush();
        }

        if( !file )
            throw imageException( "failed to write data into file" );
    }